

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

stCoRoutine_t *
co_create_env(stCoRoutineEnv_t *env,stCoRoutineAttr_t *attr,pfn_co_routine_t pfn,void *arg)

{
  uint uVar1;
  uint uVar2;
  stCoRoutine_t *psVar3;
  stStackMem_t *psVar4;
  stShareStack_t *psVar5;
  
  uVar2 = 0x20000;
  if (attr == (stCoRoutineAttr_t *)0x0) {
    psVar5 = (stShareStack_t *)0x0;
  }
  else {
    uVar1 = attr->stack_size;
    psVar5 = attr->share_stack;
    if (((0 < (int)uVar1) && (uVar2 = 0x800000, uVar1 < 0x800001)) &&
       (uVar2 = uVar1, (uVar1 & 0xfff) != 0)) {
      uVar2 = (uVar1 & 0xfff000) + 0x1000;
    }
  }
  psVar3 = (stCoRoutine_t *)calloc(1,0x20c8);
  psVar3->env = env;
  psVar3->pfn = pfn;
  psVar3->arg = arg;
  if (psVar5 == (stShareStack_t *)0x0) {
    psVar4 = co_alloc_stackmem(uVar2);
  }
  else {
    uVar1 = psVar5->alloc_idx;
    uVar2 = psVar5->stack_size;
    psVar5->alloc_idx = uVar1 + 1;
    psVar4 = psVar5->stack_array[(int)(uVar1 % (uint)psVar5->count)];
  }
  psVar3->stack_mem = psVar4;
  (psVar3->ctx).ss_sp = psVar4->stack_buffer;
  (psVar3->ctx).ss_size = (long)(int)uVar2;
  psVar3->cStart = '\0';
  psVar3->cEnd = '\0';
  psVar3->cIsMain = '\0';
  psVar3->cEnableSysHook = '\0';
  psVar3->cIsShareStack = psVar5 != (stShareStack_t *)0x0;
  psVar3->save_size = 0;
  psVar3->save_buffer = (char *)0x0;
  return psVar3;
}

Assistant:

struct stCoRoutine_t *co_create_env( stCoRoutineEnv_t * env, const stCoRoutineAttr_t* attr,
		pfn_co_routine_t pfn,void *arg )
{

	stCoRoutineAttr_t at;
	if( attr )
	{
		memcpy( &at,attr,sizeof(at) );
	}
	if( at.stack_size <= 0 )
	{
		at.stack_size = 128 * 1024;
	}
	else if( at.stack_size > 1024 * 1024 * 8 )
	{
		at.stack_size = 1024 * 1024 * 8;
	}

	if( at.stack_size & 0xFFF ) 
	{
		at.stack_size &= ~0xFFF;
		at.stack_size += 0x1000;
	}

	stCoRoutine_t *lp = (stCoRoutine_t*)malloc( sizeof(stCoRoutine_t) );
	
	memset( lp,0,(long)(sizeof(stCoRoutine_t))); 


	lp->env = env;
	lp->pfn = pfn;
	lp->arg = arg;

	stStackMem_t* stack_mem = NULL;
	if( at.share_stack )
	{
		stack_mem = co_get_stackmem( at.share_stack);
		at.stack_size = at.share_stack->stack_size;
	}
	else
	{
		stack_mem = co_alloc_stackmem(at.stack_size);
	}
	lp->stack_mem = stack_mem;

	lp->ctx.ss_sp = stack_mem->stack_buffer;
	lp->ctx.ss_size = at.stack_size;

	lp->cStart = 0;
	lp->cEnd = 0;
	lp->cIsMain = 0;
	lp->cEnableSysHook = 0;
	lp->cIsShareStack = at.share_stack != NULL;

	lp->save_size = 0;
	lp->save_buffer = NULL;

	return lp;
}